

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O3

void __thiscall chrono::ChLinkGear::UpdateTime(ChLinkGear *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChBodyFrame *pCVar19;
  bool bVar20;
  ulong uVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar59;
  double dVar60;
  double dVar61;
  undefined1 auVar62 [16];
  double dVar57;
  undefined1 auVar63 [16];
  double dVar58;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar94 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  double dVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  double dVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  double dVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  double m21;
  double m12;
  double m01;
  double m20;
  double m02;
  double m10;
  ChMatrix33<double> ma1;
  Coordsys newmarkpos;
  ChMatrix33<double> marot_beta;
  double local_3f8;
  undefined1 local_3e8 [16];
  double local_3d8;
  undefined1 local_3c8 [16];
  double local_3a8;
  ChVector<double> local_380;
  undefined1 local_368 [16];
  ChVector<double> *local_350;
  double local_348;
  double local_340;
  double local_338;
  ChMatrix33<double> *local_330;
  double local_328;
  double local_320;
  double local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  ChVector<double> local_2e0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  undefined1 local_2b0 [16];
  double local_2a0;
  double local_298;
  undefined8 uStack_290;
  double local_288;
  double local_280;
  ChVector<double> local_278;
  ChMatrix33<double> local_260;
  double local_218;
  double local_210;
  ChVector<double> *local_208;
  ChMatrix33<double> *local_200;
  ulong local_1f8;
  double local_1f0;
  ulong local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  Coordsys local_1c8;
  ChFrame<double> local_188;
  ChFrame<double> local_100;
  ChMatrix33<double> local_78;
  undefined1 auVar47 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  local_1c8.pos.m_data[2] = 0.0;
  local_100._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_1c8.pos.m_data[0] = 0.0;
  local_1c8.pos.m_data[1] = 0.0;
  local_1c8.rot.m_data[0] = 1.0;
  local_1c8.rot.m_data[1] = 0.0;
  local_1c8.rot.m_data[2] = 0.0;
  local_1c8.rot.m_data[3] = 0.0;
  local_100.coord.pos.m_data[0] = 0.0;
  local_100.coord.pos.m_data[1] = 0.0;
  local_100.coord.pos.m_data[2] = 0.0;
  local_188._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_188.coord.pos.m_data[0] = 0.0;
  local_188.coord.pos.m_data[1] = 0.0;
  local_188.coord.pos.m_data[2] = 0.0;
  local_188.coord.rot.m_data[0] = 1.0;
  local_188.coord.rot.m_data[1] = 0.0;
  local_188.coord.rot.m_data[2] = 0.0;
  local_188.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_188.Amatrix,(ChQuaternion<double> *)&local_100);
  local_100._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_100.coord.pos.m_data[2] = 0.0;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_100.coord.pos.m_data[0] = 0.0;
  local_100.coord.pos.m_data[1] = 0.0;
  local_100.coord.rot.m_data[0] = 1.0;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_100.coord.rot.m_data[1] = 0.0;
  local_100.coord.rot.m_data[2] = 0.0;
  local_100.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_100.Amatrix,(ChQuaternion<double> *)&local_260);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&local_188);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&local_100);
  Get_shaft_pos1((ChVector<double> *)&local_260,this);
  Get_shaft_pos2(&local_2e0,this);
  local_320 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
              - local_2e0.m_data[1];
  local_298 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
              - local_2e0.m_data[0];
  dVar60 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] -
           local_2e0.m_data[2];
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       local_320 *
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = local_298;
  auVar46 = vfnmsub231sd_fma(auVar96,auVar114,auVar53);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar60;
  auVar53 = vfnmadd231sd_fma(auVar46,auVar139,auVar69);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_320 * local_320;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_298;
  auVar46 = vfmadd231sd_fma(auVar62,auVar115,auVar115);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar60;
  auVar46 = vfmadd231sd_fma(auVar46,auVar140,auVar140);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar57 = auVar46._0_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_320 *
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar46 = vfnmsub231sd_fma(auVar63,auVar115,auVar1);
  dVar58 = auVar53._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar53 = vfnmadd231sd_fma(auVar46,auVar140,auVar45);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar58 * dVar58;
  auVar46 = vfmadd231sd_fma(auVar116,auVar53,auVar53);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar113 = 1.0 / auVar46._0_8_;
  bVar20 = 2.2250738585072014e-308 <= auVar46._0_8_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       local_320 *
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar46 = vfnmsub231sd_fma(auVar117,auVar114,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       local_320 *
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar1 = vfnmsub231sd_fma(auVar129,auVar114,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar69 = vfnmadd231sd_fma(auVar46,auVar139,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar46 = vfnmadd231sd_fma(auVar1,auVar139,auVar5);
  dVar61 = auVar46._0_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar61 * dVar61;
  auVar46 = vfmadd231sd_fma(auVar141,auVar69,auVar69);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar138 = 1.0 / auVar46._0_8_;
  bVar29 = 2.2250738585072014e-308 <= auVar46._0_8_;
  dVar58 = ChAtan2((double)((ulong)bVar20 * (long)(auVar53._0_8_ * dVar113) +
                           (ulong)!bVar20 * 0x3ff0000000000000),
                   (double)((ulong)bVar20 * (long)(dVar58 * dVar113)));
  auVar92._0_8_ =
       ChAtan2((double)((ulong)bVar29 * (long)(auVar69._0_8_ * dVar138) +
                       (ulong)!bVar29 * 0x3ff0000000000000),
               (double)((ulong)bVar29 * (long)(dVar61 * dVar138)));
  auVar92._8_56_ = extraout_var;
  auVar46._0_8_ = this->a1;
  auVar46._8_8_ = this->a2;
  auVar118._8_8_ = 0x401921fb54442d18;
  auVar118._0_8_ = 0x401921fb54442d18;
  auVar31._8_8_ = extraout_XMM0_Qb;
  auVar31._0_8_ = dVar58;
  auVar147._8_8_ = 0x7fffffffffffffff;
  auVar147._0_8_ = 0x7fffffffffffffff;
  auVar53 = vdivpd_avx(auVar46,auVar118);
  auVar69 = vunpcklpd_avx(auVar31,auVar92._0_16_);
  auVar53 = vroundpd_avx(auVar53,9);
  auVar1 = vfmadd231pd_fma(auVar69,auVar118,auVar53);
  auVar24._8_8_ = 0xc01921fb54442d18;
  auVar24._0_8_ = 0xc01921fb54442d18;
  auVar45 = vaddpd_avx512vl(auVar1,auVar24);
  auVar119._0_8_ = auVar1._0_8_ + 6.283185307179586;
  auVar119._8_8_ = auVar1._8_8_ + 6.283185307179586;
  auVar53 = vsubpd_avx(auVar119,auVar46);
  auVar69 = vsubpd_avx(auVar1,auVar46);
  auVar46 = vandpd_avx(auVar53,auVar147);
  auVar53 = vandpd_avx(auVar69,auVar147);
  uVar21 = vcmppd_avx512vl(auVar46,auVar53,1);
  auVar46 = vblendmpd_avx512vl(auVar1,auVar119);
  bVar20 = (bool)((byte)(uVar21 & 3) & 1);
  auVar47._0_8_ = (ulong)bVar20 * auVar46._0_8_ | (ulong)!bVar20 * auVar53._0_8_;
  uVar21 = (uVar21 & 3) >> 1;
  auVar47._8_8_ = uVar21 * auVar46._8_8_ | (ulong)!SUB81(uVar21,0) * auVar53._8_8_;
  auVar46 = vsubpd_avx(auVar45,auVar47);
  auVar53 = vsubpd_avx(auVar1,auVar47);
  auVar46 = vandpd_avx(auVar46,auVar147);
  auVar53 = vandpd_avx(auVar53,auVar147);
  uVar21 = vcmppd_avx512vl(auVar46,auVar53,1);
  bVar20 = (bool)((byte)(uVar21 & 3) & 1);
  uVar21 = (uVar21 & 3) >> 1;
  this->a1 = (double)((ulong)bVar20 * auVar45._0_8_ | !bVar20 * auVar47._0_8_);
  this->a2 = (double)(uVar21 * auVar45._8_8_ | !SUB81(uVar21,0) * auVar47._8_8_);
  dVar58 = 1.0 / dVar57;
  bVar20 = 2.2250738585072014e-308 <= dVar57;
  dVar44 = (double)((ulong)bVar20 * (long)(dVar58 * local_298) + (ulong)!bVar20 * 0x3ff0000000000000
                   );
  dVar113 = (double)((ulong)bVar20 * (long)(dVar58 * local_320));
  dVar61 = (double)((ulong)bVar20 * (long)(dVar58 * dVar60));
  Get_shaft_dir1((ChVector<double> *)&local_260,this);
  auVar120._8_8_ = 0;
  auVar120._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar44;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar61;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar113;
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       dVar44 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
  auVar46 = vfmsub231sd_fma(auVar142,auVar36,auVar64);
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       dVar61 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar53 = vfmsub231sd_fma(auVar130,auVar39,auVar120);
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       dVar113;
  auVar69 = vfmsub231sd_fma(auVar148,auVar32,auVar97);
  dVar58 = auVar46._0_8_;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar58 * dVar58;
  auVar46 = vfmadd231sd_fma(auVar153,auVar53,auVar53);
  auVar46 = vfmadd231sd_fma(auVar46,auVar69,auVar69);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar152 = 1.0 / auVar46._0_8_;
  bVar20 = 2.2250738585072014e-308 <= auVar46._0_8_;
  dVar138 = (double)((ulong)bVar20 * (long)(auVar69._0_8_ * dVar152));
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar138;
  dVar59 = (double)((ulong)bVar20 * (long)(dVar58 * dVar152));
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar59;
  local_368._0_8_ =
       (ulong)bVar20 * (long)(auVar53._0_8_ * dVar152) + (ulong)!bVar20 * 0x3ff0000000000000;
  local_368._8_8_ = 0;
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       dVar138 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar46 = vfmsub231sd_fma(auVar143,local_368,auVar120);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       dVar59 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
  auVar53 = vfmsub231sd_fma(auVar131,auVar97,auVar48);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       (double)local_368._0_8_ *
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar69 = vfmsub231sd_fma(auVar98,auVar49,auVar64);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar44 * dVar59;
  auVar1 = vfmsub231sd_fma(auVar121,auVar39,local_368);
  local_350 = auVar46._0_8_;
  local_348 = auVar53._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (double)local_350 * (double)local_350;
  auVar46 = vfmadd231sd_fma(auVar65,auVar53,auVar53);
  local_280 = auVar69._0_8_;
  auVar46 = vfmadd231sd_fma(auVar46,auVar69,auVar69);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar61 * (double)local_368._0_8_;
  auVar53 = vfmsub231sd_fma(auVar99,auVar32,auVar48);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar58 = auVar53._0_8_;
  local_288 = auVar46._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar113 * dVar138;
  auVar53 = vfmsub231sd_fma(auVar66,auVar49,auVar36);
  bVar29 = 2.2250738585072014e-308 <= local_288;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar58 * dVar58;
  auVar46 = vfmadd231sd_fma(auVar132,auVar53,auVar53);
  auVar46 = vfmadd231sd_fma(auVar46,auVar1,auVar1);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar152 = 1.0 / auVar46._0_8_;
  bVar20 = 2.2250738585072014e-308 <= auVar46._0_8_;
  local_318 = (double)((ulong)bVar20 * (long)(auVar53._0_8_ * dVar152) +
                      (ulong)!bVar20 * 0x3ff0000000000000);
  local_308 = (double)((ulong)bVar20 * (long)(dVar58 * dVar152));
  uStack_300 = 0;
  local_2f8 = (double)((ulong)bVar20 * (long)(auVar1._0_8_ * dVar152));
  uStack_310 = 0;
  uStack_2f0 = 0;
  Get_shaft_dir2((ChVector<double> *)&local_260,this);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar44;
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar61;
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar113;
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar44;
  auVar46 = vfmsub231sd_fma(auVar144,auVar67,auVar37);
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       dVar61;
  auVar53 = vfmsub231sd_fma(auVar133,auVar40,auVar122);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       dVar113;
  auVar69 = vfmsub231sd_fma(auVar149,auVar100,auVar33);
  dVar58 = auVar46._0_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar58 * dVar58;
  auVar46 = vfmadd231sd_fma(auVar154,auVar53,auVar53);
  auVar46 = vfmadd231sd_fma(auVar46,auVar69,auVar69);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  dVar152 = 1.0 / auVar46._0_8_;
  bVar20 = 2.2250738585072014e-308 <= auVar46._0_8_;
  auVar50._0_8_ =
       (double)((ulong)bVar20 * (long)(auVar53._0_8_ * dVar152) +
               (ulong)!bVar20 * 0x3ff0000000000000);
  auVar50._8_8_ = 0;
  dVar58 = (double)((ulong)bVar20 * (long)(dVar58 * dVar152));
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar58;
  dVar152 = (double)((ulong)bVar20 * (long)(auVar69._0_8_ * dVar152));
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar152;
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       dVar58 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
  auVar46 = vfmsub231sd_fma(auVar150,auVar100,auVar52);
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       dVar152 * local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar53 = vfmsub231sd_fma(auVar145,auVar50,auVar122);
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       auVar50._0_8_ *
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar69 = vfmsub231sd_fma(auVar101,auVar67,auVar51);
  local_328 = auVar46._0_8_;
  local_330 = auVar53._0_8_;
  local_338 = auVar69._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = (double)local_330 * (double)local_330;
  auVar46 = vfmadd231sd_fma(auVar68,auVar46,auVar46);
  auVar46 = vfmadd231sd_fma(auVar46,auVar69,auVar69);
  auVar46 = vsqrtsd_avx(auVar46,auVar46);
  local_340 = auVar46._0_8_;
  bVar30 = 2.2250738585072014e-308 <= local_340;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_368._0_8_;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = local_318
  ;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = local_308
  ;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_2f8
  ;
  dVar58 = this->beta;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar44;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar59;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar113;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar138;
  local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar61;
  dVar138 = cos(dVar58);
  auVar93._0_8_ = sin(dVar58);
  auVar93._8_56_ = extraout_var_00;
  auVar25._8_8_ = 0x8000000000000000;
  auVar25._0_8_ = 0x8000000000000000;
  auVar46 = vxorpd_avx512vl(auVar93._0_16_,auVar25);
  local_2c8 = auVar93._0_8_ * 0.0;
  local_2e0.m_data[1] = dVar138 * 0.0;
  local_2e0.m_data[2] = (double)vmovlpd_avx(auVar46);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_2c8;
  auVar46 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar156,ZEXT816(0x3ff0000000000000));
  local_2c0 = auVar46._0_8_;
  local_2b0._8_8_ = local_2c8;
  local_2b0._0_8_ = auVar93._0_8_ + 0.0;
  local_380.m_data[0] = (double)&local_260;
  local_380.m_data[1] = (double)&local_2e0;
  local_2e0.m_data[0] = dVar138;
  local_2b8 = local_2e0.m_data[1];
  local_2a0 = dVar138;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_78,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_380);
  local_3c8._8_8_ = 0x8000000000000000;
  local_3c8._0_8_ = 0x8000000000000000;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.react_force.m_data[0];
  uVar22 = vcmpsd_avx512f(ZEXT816(0),auVar6,0xe);
  bVar20 = (bool)((byte)uVar22 & 1);
  local_368._0_8_ = (ulong)bVar20 * (long)this->alpha + (ulong)!bVar20 * (long)-this->alpha;
  local_368._8_8_ = 0x8000000000000000;
  local_3e8._0_8_ = cos((double)local_368._0_8_);
  local_3e8._8_8_ = extraout_XMM0_Qb_00;
  auVar94._0_8_ = sin((double)local_368._0_8_);
  auVar94._8_56_ = extraout_var_01;
  auVar69 = auVar94._0_16_;
  auVar46 = vfmsub213sd_fma(ZEXT816(0) << 0x40,local_3e8,auVar69);
  local_2e0.m_data[2] = -0.0;
  local_2c8 = auVar46._0_8_;
  auVar46 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar69,local_3e8);
  local_2c0 = auVar46._0_8_;
  auVar46 = vunpcklpd_avx(auVar69,local_3e8);
  auVar53 = vunpcklpd_avx(ZEXT816(0) << 0x40,local_3c8);
  auVar69 = vunpcklpd_avx(local_3e8,auVar69);
  local_2b8 = 0.0;
  auVar102._0_8_ = auVar46._0_8_ * auVar53._0_8_;
  auVar102._8_8_ = auVar46._8_8_ * auVar53._8_8_;
  local_2b0 = vfmadd213pd_fma(auVar69,ZEXT816(0) << 0x40,auVar102);
  local_2a0 = 1.0;
  local_380.m_data[0] = (double)&local_78;
  local_380.m_data[1] = (double)&local_2e0;
  local_2e0.m_data[0] = (double)local_3e8._0_8_;
  local_2e0.m_data[1] = auVar94._0_8_;
  ChMatrix33<double>::operator=
            (&local_260,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_380);
  dVar138 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar58 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_368._0_8_ =
       local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_308 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
  ;
  local_1d0 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  local_2f8 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
  ;
  local_1d8 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
  ;
  local_318 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
  ;
  local_1e0 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  Get_shaft_dir1(&local_380,this);
  Get_shaft_dir2(&local_278,this);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_380.m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_278.m_data[0];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_380.m_data[1] * local_278.m_data[1];
  auVar46 = vfmadd231sd_fma(auVar103,auVar70,auVar7);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_380.m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_278.m_data[2];
  auVar46 = vfmadd132sd_fma(auVar71,auVar46,auVar8);
  dVar59 = acos(auVar46._0_8_);
  Get_shaft_dir1(&local_380,this);
  Get_shaft_dir2(&local_278,this);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_380.m_data[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_278.m_data[0];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_380.m_data[1] * local_278.m_data[1];
  auVar46 = vfmadd231sd_fma(auVar104,auVar72,auVar9);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_380.m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_278.m_data[2];
  auVar46 = vfmadd132sd_fma(auVar73,auVar46,auVar10);
  auVar26._8_8_ = 0x7fffffffffffffff;
  auVar26._0_8_ = 0x7fffffffffffffff;
  auVar46 = vandpd_avx512vl(auVar46,auVar26);
  if (0.96 < auVar46._0_8_) {
    dVar113 = 1.0 / local_288;
    auVar54._0_8_ =
         (ulong)bVar29 * (long)(dVar113 * local_348) + (ulong)!bVar29 * 0x3ff0000000000000;
    auVar54._8_8_ = 0;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = local_298;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = (ulong)bVar29 * (long)(dVar113 * local_280);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = (double)((ulong)bVar29 * (long)(dVar113 * (double)local_350)) * local_320;
    auVar46 = vfmadd213sd_fma(auVar123,auVar54,auVar105);
    auVar134._8_8_ = 0;
    auVar134._0_8_ = dVar60;
    auVar46 = vfmadd213sd_fma(auVar134,auVar55,auVar46);
    dVar60 = this->tau;
    dVar113 = auVar46._0_8_;
    if (this->epicyclic == false) {
      dVar61 = dVar113 / (1.0 / dVar60 + 1.0);
    }
    else {
      dVar61 = (dVar113 * dVar60) / (dVar60 + -1.0);
    }
    this->r2 = dVar113 - dVar61;
    dVar60 = dVar60 * (dVar113 - dVar61);
  }
  else {
    bVar20 = this->epicyclic;
    local_298 = this->tau;
    uStack_290 = 0;
    Get_shaft_dir2(&local_380,this);
    auVar41._8_8_ = uStack_290;
    auVar41._0_8_ = local_298;
    auVar27._8_8_ = 0x8000000000000000;
    auVar27._0_8_ = 0x8000000000000000;
    auVar53 = vxorpd_avx512vl(auVar41,auVar27);
    lVar23 = (ulong)!(bool)(bVar20 & 1) * (long)local_298;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar44;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_380.m_data[0];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar113 * local_380.m_data[1];
    auVar46 = vfmadd231sd_fma(auVar74,auVar34,auVar11);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar61;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_380.m_data[2];
    auVar46 = vfmadd231sd_fma(auVar46,auVar38,auVar12);
    dVar60 = acos(auVar46._0_8_);
    dVar113 = sin((dVar60 + -3.141592653589793 + 3.141592653589793) - dVar59);
    dVar61 = sin(dVar59);
    dVar60 = tan(dVar59 / ((double)((ulong)(bVar20 & 1) * auVar53._0_8_ + lVar23) + 1.0));
    dVar60 = dVar60 * (dVar57 / dVar61) * dVar113;
    this->r2 = dVar60;
    dVar60 = dVar60 * this->tau;
  }
  this->r1 = dVar60;
  Get_shaft_pos2(&local_380,this);
  dVar61 = 1.0 / local_340;
  dVar60 = this->r2;
  dVar113 = (double)((ulong)bVar30 * (long)(dVar61 * local_328) +
                    (ulong)!bVar30 * 0x3ff0000000000000) * dVar60 + local_380.m_data[0];
  local_3d8 = (double)((ulong)bVar30 * (long)(dVar61 * (double)local_330)) * dVar60 +
              local_380.m_data[1];
  local_3a8 = (double)((ulong)bVar30 * (long)(dVar61 * local_338)) * dVar60 + local_380.m_data[2];
  (this->contact_pt).m_data[0] = dVar113;
  (this->contact_pt).m_data[1] = local_3d8;
  (this->contact_pt).m_data[2] = local_3a8;
  local_3f8 = dVar113;
  local_320 = local_3a8;
  local_298 = local_3d8;
  if (this->checkphase != false) {
    dVar60 = (-this->a2 /
              (double)((ulong)(this->epicyclic & 1) * (long)-this->tau +
                      (ulong)!(bool)(this->epicyclic & 1) * (long)this->tau) - this->a1) -
             this->phase;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar60;
    uVar22 = vcmpsd_avx512f(auVar75,ZEXT816(0x400921fb54442d18),0xe);
    bVar20 = (bool)((byte)uVar22 & 1);
    auVar56._0_8_ =
         (ulong)bVar20 * (long)(dVar60 + -6.283185307179586) + (ulong)!bVar20 * (long)dVar60;
    auVar56._8_8_ = 0;
    auVar46 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar56);
    uVar22 = vcmpsd_avx512f(auVar46,ZEXT816(0xbfe921fb54442d18),1);
    bVar20 = (bool)((byte)uVar22 & 1);
    dVar60 = (double)((ulong)bVar20 * 0x3fe921fb54442d18 +
                     (ulong)!bVar20 * (auVar46._0_8_ ^ 0x8000000000000000));
    dVar61 = cos(dVar60);
    auVar95._0_8_ = sin(dVar60);
    auVar95._8_56_ = extraout_var_02;
    auVar35._8_8_ = extraout_XMM0_Qb_01;
    auVar35._0_8_ = dVar61;
    auVar69 = auVar95._0_16_;
    auVar46 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar35,auVar69);
    local_2e0.m_data[2] = -0.0;
    auVar53 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar69,auVar35);
    local_2c8 = auVar46._0_8_;
    auVar46 = vunpcklpd_avx(ZEXT816(0) << 0x40,local_3c8);
    local_2c0 = auVar53._0_8_;
    auVar53 = vunpcklpd_avx(auVar69,auVar35);
    auVar69 = vunpcklpd_avx(auVar35,auVar69);
    local_2b8 = 0.0;
    auVar106._0_8_ = auVar53._0_8_ * auVar46._0_8_;
    auVar106._8_8_ = auVar53._8_8_ * auVar46._8_8_;
    local_2b0 = vfmadd213pd_fma(auVar69,ZEXT816(0) << 0x40,auVar106);
    local_2a0 = 1.0;
    local_2e0.m_data[0] = dVar61;
    local_2e0.m_data[1] = auVar95._0_8_;
    Get_shaft_pos1(&local_380,this);
    local_208 = (ChVector<double> *)local_380.m_data[1];
    local_218 = local_380.m_data[2];
    local_200 = (ChMatrix33<double> *)local_380.m_data[0];
    local_328 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    local_348 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_338 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    local_350 = (ChVector<double> *)local_2e0.m_data[0];
    local_288 = local_2e0.m_data[1];
    local_280 = local_2e0.m_data[2];
    local_1e8 = (ulong)local_2c8;
    local_1f0 = local_2c0;
    local_340 = local_2b8;
    local_1f8 = local_2b0._0_8_;
    local_210 = (double)local_2b0._8_8_;
    local_330 = (ChMatrix33<double> *)local_2a0;
    Get_shaft_pos1(&local_380,this);
    auVar159._8_8_ = 0;
    auVar159._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar158._8_8_ = 0;
    auVar158._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar157._8_8_ = 0;
    auVar157._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar151._8_8_ = 0;
    auVar151._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar155._8_8_ = 0;
    auVar155._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar162._8_8_ = 0;
    auVar162._0_8_ = local_338;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = local_328;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_1f8;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_1e8;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_330;
    dVar60 = local_298 - (double)local_208;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar113 - (double)local_200;
    auVar135._8_8_ = 0;
    auVar135._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         dVar60;
    auVar46 = vfmadd231sd_fma(auVar135,auVar157,auVar107);
    auVar146._8_8_ = 0;
    auVar146._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
         dVar60;
    auVar53 = vfmadd231sd_fma(auVar146,auVar151,auVar107);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = dVar113 - (double)local_200;
    auVar124._8_8_ = 0;
    auVar124._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar60;
    auVar69 = vfmadd231sd_fma(auVar124,auVar155,auVar108);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_348;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_320 - local_218;
    auVar1 = vfmadd231sd_fma(auVar46,auVar162,auVar76);
    auVar45 = vfmadd231sd_fma(auVar53,auVar160,auVar76);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_320 - local_218;
    auVar46 = vfmadd231sd_fma(auVar69,auVar109,auVar77);
    dVar60 = auVar46._0_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar60 * local_210;
    auVar46 = vfmadd213sd_fma(auVar163,auVar45,auVar78);
    auVar46 = vfmadd213sd_fma(auVar161,auVar1,auVar46);
    auVar164._8_8_ = 0;
    auVar164._0_8_ = local_340;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar60 * local_1f0;
    auVar53 = vfmadd213sd_fma(auVar165,auVar45,auVar79);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_350;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar60 * local_288;
    auVar69 = vfmadd231sd_fma(auVar80,auVar45,auVar13);
    auVar53 = vfmadd213sd_fma(auVar164,auVar1,auVar53);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_280;
    auVar69 = vfmadd231sd_fma(auVar69,auVar1,auVar14);
    dVar60 = auVar53._0_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = dVar60 * local_348;
    auVar53 = vfmadd231sd_fma(auVar110,auVar69,auVar160);
    auVar125._8_8_ = 0;
    auVar125._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar60;
    auVar1 = vfmadd231sd_fma(auVar125,auVar69,auVar158);
    auVar136._8_8_ = 0;
    auVar136._0_8_ =
         dVar60 * local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar69 = vfmadd231sd_fma(auVar136,auVar151,auVar69);
    auVar53 = vfmadd231sd_fma(auVar53,auVar46,auVar162);
    auVar1 = vfmadd231sd_fma(auVar1,auVar46,auVar159);
    auVar46 = vfmadd231sd_fma(auVar69,auVar157,auVar46);
    local_3f8 = auVar46._0_8_ + local_380.m_data[0];
    local_3d8 = auVar1._0_8_ + local_380.m_data[1];
    local_3a8 = auVar53._0_8_ + local_380.m_data[2];
  }
  Get_shaft_dir1(&local_380,this);
  Get_shaft_pos1(&local_278,this);
  dVar60 = (this->contact_pt).m_data[1];
  dVar61 = (this->contact_pt).m_data[0];
  local_340 = (this->contact_pt).m_data[2];
  local_328 = local_278.m_data[1];
  local_348 = local_278.m_data[2];
  local_330 = (ChMatrix33<double> *)local_380.m_data[0];
  local_350 = (ChVector<double> *)local_380.m_data[1];
  local_338 = local_380.m_data[2];
  Get_shaft_dir1(&local_380,this);
  dVar43 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar42 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar57 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar44 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar152 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar59 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_330;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = (dVar60 - local_328) * (double)local_350;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar61 - local_278.m_data[0];
  auVar46 = vfmadd231sd_fma(auVar81,auVar126,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_338;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_340 - local_348;
  auVar46 = vfmadd231sd_fma(auVar46,auVar111,auVar16);
  auVar28._8_8_ = 0x7fffffffffffffff;
  auVar28._0_8_ = 0x7fffffffffffffff;
  auVar53 = vandpd_avx512vl(auVar46,auVar28);
  if (0.0001 < auVar53._0_8_) {
    dVar61 = auVar46._0_8_;
    local_380.m_data[2] = dVar61 * local_380.m_data[2];
    dVar60 = dVar61 * local_380.m_data[0];
    dVar61 = dVar61 * local_380.m_data[1];
    pCVar19 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         *(double *)
          ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x10);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = dVar60;
    auVar137._8_8_ = 0;
    auVar137._0_8_ =
         dVar61 * *(double *)
                   ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x28);
    auVar46 = vfmadd231sd_fma(auVar137,auVar127,auVar17);
    auVar82._0_8_ =
         dVar61 * *(double *)
                   ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x18);
    auVar82._8_8_ =
         dVar61 * *(double *)
                   ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x20);
    auVar128._8_8_ = dVar60;
    auVar128._0_8_ = dVar60;
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         *(double *)
          ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x40);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_380.m_data[2];
    auVar53 = vfmadd231sd_fma(auVar46,auVar112,auVar18);
    auVar46 = vfmadd132pd_fma(auVar128,auVar82,
                              *(undefined1 (*) [16])
                               (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar83._8_8_ = local_380.m_data[2];
    auVar83._0_8_ = local_380.m_data[2];
    dVar60 = (this->local_shaft1).coord.pos.m_data[2];
    auVar46 = vfmadd132pd_fma(auVar83,auVar46,
                              *(undefined1 (*) [16])
                               ((long)&(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.
                                       Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data + 0x30));
    dVar61 = (this->local_shaft1).coord.pos.m_data[1];
    (this->local_shaft1).coord.pos.m_data[0] =
         auVar46._0_8_ + (this->local_shaft1).coord.pos.m_data[0];
    (this->local_shaft1).coord.pos.m_data[1] = auVar46._8_8_ + dVar61;
    (this->local_shaft1).coord.pos.m_data[2] = auVar53._0_8_ + dVar60;
  }
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->motion_type = M_MOTION_EXTERNAL;
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->motion_type = M_MOTION_EXTERNAL;
  local_1c8.pos.m_data[0] = local_3f8;
  local_1c8.pos.m_data[1] = local_3d8;
  local_1c8.pos.m_data[2] = local_3a8;
  dVar60 = local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
           local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] +
           local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  if (0.0 <= dVar60) {
    dVar60 = dVar60 + 1.0;
    if (dVar60 < 0.0) {
      local_1c8.rot.m_data[3] = sqrt(dVar60);
    }
    else {
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar60;
      auVar46 = vsqrtsd_avx(auVar85,auVar85);
      local_1c8.rot.m_data[3] = auVar46._0_8_;
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[3] * 0.5;
    local_1c8.rot.m_data[3] = 0.5 / local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[1] = (dVar43 - dVar57) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[2] = (dVar152 - dVar42) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[3] = (dVar44 - dVar59) * local_1c8.rot.m_data[3];
  }
  else {
    if (local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] <=
        local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]) {
      if (local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] <
          local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
      goto LAB_00594fb9;
      dVar60 = ((local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] - local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4]) -
               local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8]) + 1.0;
      if (dVar60 < 0.0) {
        dVar60 = sqrt(dVar60);
      }
      else {
        auVar87._8_8_ = 0;
        auVar87._0_8_ = dVar60;
        auVar46 = vsqrtsd_avx(auVar87,auVar87);
        dVar60 = auVar46._0_8_;
      }
      local_1c8.rot.m_data[0] = dVar43 - dVar57;
      local_1c8.rot.m_data[1] = dVar60 * 0.5;
      dVar60 = 0.5 / dVar60;
      local_1c8.rot.m_data[2] = (dVar59 + dVar44) * dVar60;
      local_1c8.rot.m_data[3] = (dVar42 + dVar152) * dVar60;
    }
    else if (local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
             < local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8]) {
LAB_00594fb9:
      dVar60 = ((local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8] - local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0]) -
               local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4]) + 1.0;
      if (dVar60 < 0.0) {
        dVar60 = sqrt(dVar60);
      }
      else {
        auVar86._8_8_ = 0;
        auVar86._0_8_ = dVar60;
        auVar46 = vsqrtsd_avx(auVar86,auVar86);
        dVar60 = auVar46._0_8_;
      }
      local_1c8.rot.m_data[0] = dVar44 - dVar59;
      local_1c8.rot.m_data[3] = dVar60 * 0.5;
      dVar60 = 0.5 / dVar60;
      local_1c8.rot.m_data[1] = (dVar42 + dVar152) * dVar60;
      local_1c8.rot.m_data[2] = (dVar57 + dVar43) * dVar60;
    }
    else {
      dVar60 = ((local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4] - local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]) -
               local_260.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0]) + 1.0;
      if (dVar60 < 0.0) {
        dVar60 = sqrt(dVar60);
      }
      else {
        auVar84._8_8_ = 0;
        auVar84._0_8_ = dVar60;
        auVar46 = vsqrtsd_avx(auVar84,auVar84);
        dVar60 = auVar46._0_8_;
      }
      local_1c8.rot.m_data[0] = dVar152 - dVar42;
      local_1c8.rot.m_data[2] = dVar60 * 0.5;
      dVar60 = 0.5 / dVar60;
      local_1c8.rot.m_data[3] = (dVar57 + dVar43) * dVar60;
      local_1c8.rot.m_data[1] = (dVar59 + dVar44) * dVar60;
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[0] * dVar60;
  }
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker1,&local_1c8);
  local_1c8.pos.m_data[1] = local_298;
  local_1c8.pos.m_data[2] = local_320;
  dVar60 = local_1d0 + local_1d8 + local_1e0;
  local_1c8.pos.m_data[0] = dVar113;
  if (0.0 <= dVar60) {
    dVar60 = dVar60 + 1.0;
    if (dVar60 < 0.0) {
      local_1c8.rot.m_data[3] = sqrt(dVar60);
    }
    else {
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar60;
      auVar46 = vsqrtsd_avx(auVar89,auVar89);
      local_1c8.rot.m_data[3] = auVar46._0_8_;
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[3] * 0.5;
    local_1c8.rot.m_data[3] = 0.5 / local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[1] = (dVar138 - dVar58) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[2] = (local_308 - local_318) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[3] = (local_2f8 - (double)local_368._0_8_) * local_1c8.rot.m_data[3];
    goto LAB_00595480;
  }
  if (local_1d8 <= local_1d0) {
    if (local_1d0 < local_1e0) goto LAB_005952ba;
    dVar60 = ((local_1d0 - local_1d8) - local_1e0) + 1.0;
    if (dVar60 < 0.0) {
      dVar60 = sqrt(dVar60);
    }
    else {
      auVar91._8_8_ = 0;
      auVar91._0_8_ = dVar60;
      auVar46 = vsqrtsd_avx(auVar91,auVar91);
      dVar60 = auVar46._0_8_;
    }
    local_1c8.rot.m_data[1] = dVar60 * 0.5;
    dVar60 = 0.5 / dVar60;
    local_1c8.rot.m_data[0] = dVar138 - dVar58;
    local_1c8.rot.m_data[2] = ((double)local_368._0_8_ + local_2f8) * dVar60;
    local_1c8.rot.m_data[3] = (local_308 + local_318) * dVar60;
  }
  else if (local_1d8 < local_1e0) {
LAB_005952ba:
    dVar60 = ((local_1e0 - local_1d0) - local_1d8) + 1.0;
    if (dVar60 < 0.0) {
      dVar60 = sqrt(dVar60);
    }
    else {
      auVar90._8_8_ = 0;
      auVar90._0_8_ = dVar60;
      auVar46 = vsqrtsd_avx(auVar90,auVar90);
      dVar60 = auVar46._0_8_;
    }
    local_1c8.rot.m_data[3] = dVar60 * 0.5;
    dVar60 = 0.5 / dVar60;
    local_1c8.rot.m_data[0] = local_2f8 - (double)local_368._0_8_;
    local_1c8.rot.m_data[1] = (local_308 + local_318) * dVar60;
    local_1c8.rot.m_data[2] = (dVar138 + dVar58) * dVar60;
  }
  else {
    dVar60 = ((local_1d8 - local_1e0) - local_1d0) + 1.0;
    if (dVar60 < 0.0) {
      dVar60 = sqrt(dVar60);
    }
    else {
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar60;
      auVar46 = vsqrtsd_avx(auVar88,auVar88);
      dVar60 = auVar46._0_8_;
    }
    local_1c8.rot.m_data[2] = dVar60 * 0.5;
    dVar60 = 0.5 / dVar60;
    local_1c8.rot.m_data[3] = (dVar138 + dVar58) * dVar60;
    local_1c8.rot.m_data[0] = local_308 - local_318;
    local_1c8.rot.m_data[1] = ((double)local_368._0_8_ + local_2f8) * dVar60;
  }
  local_1c8.rot.m_data[0] = local_1c8.rot.m_data[0] * dVar60;
LAB_00595480:
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker2,&local_1c8);
  return;
}

Assistant:

void ChLinkGear::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLock::UpdateTime(mytime);

    // Move markers 1 and 2 to align them as gear teeth

    ChVector<> mx;
    ChVector<> my;
    ChVector<> mz;
    ChVector<> mr;
    ChVector<> mmark1;
    ChVector<> mmark2;
    ChVector<> lastX;
    ChVector<> vrota;
    Coordsys newmarkpos;

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> vbdist = Vsub(Get_shaft_pos1(), Get_shaft_pos2());
    ////ChVector<> Trad1 = Vnorm(Vcross(Get_shaft_dir1(), Vnorm(Vcross(Get_shaft_dir1(), vbdist))));
    ////ChVector<> Trad2 = Vnorm(Vcross(Vnorm(Vcross(Get_shaft_dir2(), vbdist)), Get_shaft_dir2()));

    double dist = Vlength(vbdist);

    // compute actual rotation of the two wheels (relative to truss).
    ChVector<> md1 = abs_shaft1.GetA().transpose() * (-vbdist);
    md1.z() = 0;
    md1 = Vnorm(md1);
    ChVector<> md2 = abs_shaft2.GetA().transpose() * (-vbdist);
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // compute new markers coordsystem alignment
    my = Vnorm(vbdist);
    mz = Get_shaft_dir1();
    mx = Vnorm(Vcross(my, mz));
    mr = Vnorm(Vcross(mz, mx));
    mz = Vnorm(Vcross(mx, my));
    ChVector<> mz2, mx2, mr2, my2;
    my2 = my;
    mz2 = Get_shaft_dir2();
    mx2 = Vnorm(Vcross(my2, mz2));
    mr2 = Vnorm(Vcross(mz2, mx2));

    ChMatrix33<> ma1(mx, my, mz);

    // rotate csys because of beta
    vrota.x() = 0.0;
    vrota.y() = beta;
    vrota.z() = 0.0;
    ChMatrix33<> mrotma;
    mrotma.Set_A_Rxyz(vrota);
    ChMatrix33<> marot_beta = ma1 * mrotma;
    // rotate csys because of alpha
    vrota.x() = 0.0;
    vrota.y() = 0.0;
    vrota.z() = alpha;
    if (react_force.x() < 0)
        vrota.z() = alpha;
    else
        vrota.z() = -alpha;
    mrotma.Set_A_Rxyz(vrota);
    ma1 = marot_beta * mrotma;

    ChMatrix33<> ma2 = ma1;

    // is a bevel gear?
    double be = acos(Vdot(Get_shaft_dir1(), Get_shaft_dir2()));
    bool is_bevel = true;
    if (fabs(Vdot(Get_shaft_dir1(), Get_shaft_dir2())) > 0.96)
        is_bevel = false;

    // compute wheel radii so that:
    //            w2 = - tau * w1
    if (!is_bevel) {
        double pardist = Vdot(mr, vbdist);
        double inv_tau = 1.0 / tau;
        if (!epicyclic) {
            r2 = pardist - pardist / (inv_tau + 1.0);
        } else {
            r2 = pardist - (tau * pardist) / (tau - 1.0);
        }
        r1 = r2 * tau;
    } else {
        double gamma2;
        if (!epicyclic) {
            gamma2 = be / (tau + 1.0);
        } else {
            gamma2 = be / (-tau + 1.0);
        }
        double al = CH_C_PI - acos(Vdot(Get_shaft_dir2(), my));
        double te = CH_C_PI - al - be;
        double fd = sin(te) * (dist / sin(be));
        r2 = fd * tan(gamma2);
        r1 = r2 * tau;
    }

    // compute markers positions, supposing they
    // stay on the ideal wheel contact point
    mmark1 = Vadd(Get_shaft_pos2(), Vmul(mr2, r2));
    mmark2 = mmark1;
    contact_pt = mmark1;

    // correct marker 1 position if phasing is not correct
    if (checkphase) {
        double realtau = tau;
        if (epicyclic)
            realtau = -tau;
        double m_delta;
        m_delta = -(a2 / realtau) - a1 - phase;

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);

        vrota.x() = vrota.y() = 0.0;
        vrota.z() = -m_delta;
        mrotma.Set_A_Rxyz(vrota);  // rotate about Z of shaft to correct
        mmark1 = abs_shaft1.GetA().transpose() * (mmark1 - Get_shaft_pos1());
        mmark1 = mrotma * mmark1;
        mmark1 = abs_shaft1.GetA() * mmark1 + Get_shaft_pos1();
    }
    // Move Shaft 1 along its direction if not aligned to wheel
    double offset = Vdot(Get_shaft_dir1(), (contact_pt - Get_shaft_pos1()));
    ChVector<> moff = Get_shaft_dir1() * offset;
    if (fabs(offset) > 0.0001)
        local_shaft1.SetPos(local_shaft1.GetPos() + Body1->TransformDirectionParentToLocal(moff));

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    // move marker1 in proper positions
    newmarkpos.pos = mmark1;
    newmarkpos.rot = ma1.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = mmark2;
    newmarkpos.rot = ma2.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position
}